

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O1

void xmlBufferEmpty(xmlBufferPtr buf)

{
  xmlChar *pxVar1;
  xmlChar *pxVar2;
  
  if ((buf != (xmlBufferPtr)0x0) && (pxVar1 = buf->content, pxVar1 != (xmlChar *)0x0)) {
    buf->use = 0;
    pxVar2 = pxVar1;
    if (buf->alloc == XML_BUFFER_ALLOC_IO) {
      pxVar2 = buf->contentIO;
      buf->size = buf->size + ((int)pxVar1 - (int)pxVar2);
      buf->content = pxVar2;
    }
    *pxVar2 = '\0';
  }
  return;
}

Assistant:

void
xmlBufferEmpty(xmlBufferPtr buf) {
    if (buf == NULL)
        return;
    if (buf->content == NULL)
        return;

    buf->use = 0;

    if (buf->alloc == XML_BUFFER_ALLOC_IO) {
	buf->size += buf->content - buf->contentIO;
        buf->content = buf->contentIO;
        buf->content[0] = 0;
    } else {
        buf->content[0] = 0;
    }
}